

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

char * strtokcpy(char *to,size_t to_len,char *from,char delim)

{
  bool bVar1;
  uint local_30;
  uint i;
  char delim_local;
  char *from_local;
  size_t to_len_local;
  char *to_local;
  
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if (((ulong)local_30 < to_len - 1) && (bVar1 = false, from[local_30] != '\0')) {
      bVar1 = from[local_30] != delim;
    }
    if (!bVar1) break;
    to[local_30] = from[local_30];
    local_30 = local_30 + 1;
  }
  to[local_30] = '\0';
  if ((local_30 == 0) || (from[local_30] == '\0')) {
    to_local = (char *)0x0;
  }
  else {
    to_local = from + (ulong)local_30 + 1;
  }
  return to_local;
}

Assistant:

static const char *strtokcpy(char *to, size_t to_len, const char *from, char delim)
{
    unsigned int i = 0;

        for (; i < (to_len - 1) && from[i] && from[i] != delim; i++)
                to[i] = from[i];
        to[i] = '\0';

        if (i && from[i] != '\0')
                return from + i + 1;

        return NULL;
}